

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void apx_server_trigger_log_event(apx_server_t *self,apx_logLevel_t level,char *label,char *msg)

{
  undefined8 local_30;
  adt_list_elem_t *iter;
  char *msg_local;
  char *label_local;
  apx_logLevel_t level_local;
  apx_server_t *self_local;
  
  for (local_30 = adt_list_iter_first(&self->server_event_listeners);
      local_30 != (adt_list_elem_t *)0x0; local_30 = adt_list_iter_next(local_30)) {
  }
  return;
}

Assistant:

static void apx_server_trigger_log_event(apx_server_t* self, apx_logLevel_t level, const char* label, const char* msg)
{
   adt_list_elem_t *iter = adt_list_iter_first(&self->server_event_listeners);
   (void)level;
   (void)label;
   (void)msg;
   while(iter != 0)
   {
/*
      apx_serverEventListener_t *listener = (apx_serverEventListener_t*) iter->pItem;
      if ( (listener != 0) && (listener->serverConnected != 0) )
      {
         listener->logEvent(listener->arg, level, label, msg);
      }
*/
      iter = adt_list_iter_next(iter);
   }
}